

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_hex.hxx
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 cryptox::
 to_hex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  last,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           d_first)

{
  byte bVar1;
  
  if (first._M_current != last._M_current) {
    bVar1 = 1;
    do {
      std::__cxx11::string::push_back((char)d_first.container);
      bVar1 = bVar1 ^ 1;
      first._M_current = first._M_current + bVar1;
    } while (first._M_current != last._M_current);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )d_first.container;
}

Assistant:

Output to_hex(Input first, Input last, Output d_first) {
		bool is_high_nibble = true;
		while (first != last) {
			const int index = *first >> (is_high_nibble? 4 : 0);
			*d_first++ = "0123456789abcdef"[index & 0x0f];

			is_high_nibble = !is_high_nibble;
			if (is_high_nibble)
				++first;
		}

		return d_first;
	}